

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

bool chaiscript::dispatch::Proxy_Function_Base::compare_types
               (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *tis,
               Function_Params *bvs,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  size_type sVar2;
  size_t sVar3;
  const_reference ti;
  Boxed_Value *bv;
  ulong local_38;
  size_t i;
  size_t size;
  Type_Conversions_State *t_conversions_local;
  Function_Params *bvs_local;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *tis_local;
  
  sVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size(tis);
  sVar3 = Function_Params::size(bvs);
  if (sVar2 - 1 == sVar3) {
    sVar3 = Function_Params::size(bvs);
    for (local_38 = 0; local_38 < sVar3; local_38 = local_38 + 1) {
      ti = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::operator[]
                     (tis,local_38 + 1);
      bv = Function_Params::operator[](bvs,local_38);
      bVar1 = compare_type_to_param(ti,bv,t_conversions);
      if (!bVar1) {
        return false;
      }
    }
    tis_local._7_1_ = true;
  }
  else {
    tis_local._7_1_ = false;
  }
  return tis_local._7_1_;
}

Assistant:

static bool compare_types(const std::vector<Type_Info> &tis, const Function_Params &bvs, const Type_Conversions_State &t_conversions) noexcept {
        if (tis.size() - 1 != bvs.size()) {
          return false;
        } else {
          const size_t size = bvs.size();
          for (size_t i = 0; i < size; ++i) {
            if (!compare_type_to_param(tis[i + 1], bvs[i], t_conversions)) {
              return false;
            }
          }
        }
        return true;
      }